

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void print_stack_union(FILE *out,lemon *lemp,int *plineno,int mhflag)

{
  byte *pbVar1;
  symbol **ppsVar2;
  symbol *psVar3;
  symbol *psVar4;
  ushort *puVar5;
  void *__ptr;
  symbol **__nmemb;
  int iVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  void *__ptr_00;
  size_t sVar10;
  size_t sVar11;
  symbol **__s1;
  ushort **ppuVar12;
  char *pcVar13;
  ulong uVar14;
  char *pcVar15;
  char cVar16;
  symbol **__s2;
  symbol **ppsVar17;
  long lVar18;
  char *pcVar19;
  ulong uVar20;
  bool bVar21;
  uint local_60;
  
  iVar8 = lemp->nsymbol;
  lVar9 = (long)iVar8;
  __nmemb = (symbol **)(lVar9 * 2);
  __s2 = (symbol **)0x8;
  ppsVar17 = __nmemb;
  __ptr_00 = calloc((size_t)__nmemb,8);
  if (__ptr_00 == (void *)0x0) {
LAB_0010be11:
    print_stack_union_cold_3();
  }
  else {
    pcVar15 = lemp->vartype;
    if (pcVar15 == (char *)0x0) {
      sVar10 = 0;
    }
    else {
      sVar10 = strlen(pcVar15);
    }
    iVar6 = (int)sVar10;
    if (0 < iVar8) {
      ppsVar17 = lemp->symbols;
      lVar18 = 0;
      do {
        pcVar19 = ppsVar17[lVar18]->datatype;
        if (pcVar19 != (char *)0x0) {
          sVar11 = strlen(pcVar19);
          uVar7 = (uint)sVar11;
          if ((int)(uint)sVar11 < (int)(uint)sVar10) {
            uVar7 = (uint)sVar10;
          }
          sVar10 = (size_t)uVar7;
        }
        iVar6 = (int)sVar10;
        lVar18 = lVar18 + 1;
      } while (lVar9 != lVar18);
    }
    ppsVar17 = (symbol **)(long)(iVar6 * 2 + 1);
    __s1 = (symbol **)malloc((size_t)ppsVar17);
    if (__s1 != (symbol **)0x0) {
      local_60 = (uint)__nmemb;
      if (0 < iVar8) {
        ppsVar2 = lemp->symbols;
        psVar3 = lemp->errsym;
        lVar18 = 0;
        do {
          psVar4 = ppsVar2[lVar18];
          if (psVar4 == psVar3) {
            psVar4->dtnum = local_60 | 1;
          }
          else if ((psVar4->type == NONTERMINAL) &&
                  (pcVar19 = psVar4->datatype, pcVar15 != (char *)0x0 || pcVar19 != (char *)0x0)) {
            if (pcVar19 == (char *)0x0) {
              pcVar19 = pcVar15;
            }
            ppuVar12 = __ctype_b_loc();
            puVar5 = *ppuVar12;
            pcVar13 = pcVar19 + -1;
            do {
              pcVar19 = pcVar19 + 1;
              pbVar1 = (byte *)(pcVar13 + 1);
              pcVar13 = pcVar13 + 1;
            } while ((*(byte *)((long)puVar5 + (ulong)*pbVar1 * 2 + 1) & 0x20) != 0);
            uVar14 = 0;
            cVar16 = *pcVar13;
            while (cVar16 != '\0') {
              *(char *)((long)__s1 + uVar14) = cVar16;
              uVar14 = uVar14 + 1;
              cVar16 = *pcVar19;
              pcVar19 = pcVar19 + 1;
            }
            if (0 < (int)uVar14) {
              do {
                iVar6 = (int)uVar14;
                if ((*(byte *)((long)puVar5 +
                              (ulong)*(byte *)((long)__s1 + ((uVar14 & 0xffffffff) - 1)) * 2 + 1) &
                    0x20) == 0) goto LAB_0010bb0e;
                uVar14 = (ulong)(iVar6 - 1);
              } while (1 < iVar6);
              uVar14 = 0;
            }
LAB_0010bb0e:
            *(char *)((long)__s1 + (long)(int)uVar14) = '\0';
            __s2 = (symbol **)lemp->tokentype;
            if ((__s2 == (symbol **)0x0) || (iVar6 = strcmp((char *)__s1,(char *)__s2), iVar6 != 0))
            {
              cVar16 = *(char *)__s1;
              uVar7 = 0;
              ppsVar17 = __s1;
              if (cVar16 != '\0') {
                do {
                  __s2 = (symbol **)(ulong)(uVar7 * 0x35);
                  uVar7 = (int)cVar16 + uVar7 * 0x35;
                  cVar16 = *(char *)((long)ppsVar17 + 1);
                  ppsVar17 = (symbol **)((long)ppsVar17 + 1);
                } while (cVar16 != '\0');
                uVar7 = uVar7 & 0x7fffffff;
              }
              uVar14 = (ulong)uVar7 % ((ulong)__nmemb & 0xffffffff);
              uVar7 = (uint)uVar14;
              pcVar19 = *(char **)((long)__ptr_00 + uVar14 * 8);
              bVar21 = pcVar19 == (char *)0x0;
              if (!bVar21) {
                __s2 = __s1;
                iVar6 = strcmp(pcVar19,(char *)__s1);
                while (uVar7 = (uint)uVar14, iVar6 != 0) {
                  uVar7 = uVar7 + 1;
                  if (local_60 <= uVar7) {
                    uVar7 = 0;
                  }
                  uVar14 = (ulong)uVar7;
                  pcVar19 = *(char **)((long)__ptr_00 + uVar14 * 8);
                  bVar21 = pcVar19 == (char *)0x0;
                  if (bVar21) goto LAB_0010bbf9;
                  __s2 = __s1;
                  iVar6 = strcmp(pcVar19,(char *)__s1);
                }
                psVar4->dtnum = uVar7 + 1;
                __s2 = ppsVar2;
                if (!bVar21) goto LAB_0010bc43;
              }
LAB_0010bbf9:
              psVar4->dtnum = uVar7 + 1;
              sVar10 = strlen((char *)__s1);
              ppsVar17 = (symbol **)(long)((int)sVar10 + 1);
              pcVar19 = (char *)malloc((size_t)ppsVar17);
              *(char **)((long)__ptr_00 + uVar14 * 8) = pcVar19;
              if (pcVar19 == (char *)0x0) {
                print_stack_union_cold_1();
                goto LAB_0010be11;
              }
              strcpy(pcVar19,(char *)__s1);
            }
            else {
              psVar4->dtnum = 0;
            }
          }
          else {
            psVar4->dtnum = 0;
          }
LAB_0010bc43:
          lVar18 = lVar18 + 1;
        } while (lVar18 != lVar9);
      }
      pcVar15 = "Parse";
      if (lemp->name != (char *)0x0) {
        pcVar15 = lemp->name;
      }
      iVar6 = *plineno;
      if (mhflag != 0) {
        fwrite("#if INTERFACE\n",0xe,1,(FILE *)out);
        iVar6 = iVar6 + 1;
      }
      pcVar19 = "void*";
      if (lemp->tokentype != (char *)0x0) {
        pcVar19 = lemp->tokentype;
      }
      fprintf((FILE *)out,"#define %sTOKENTYPE %s\n",pcVar15,pcVar19);
      if (mhflag == 0) {
        iVar6 = iVar6 + 1;
      }
      else {
        fwrite("#endif\n",7,1,(FILE *)out);
        iVar6 = iVar6 + 2;
      }
      fwrite("typedef union {\n",0x10,1,(FILE *)out);
      fwrite("  int yyinit;\n",0xe,1,(FILE *)out);
      fprintf((FILE *)out,"  %sTOKENTYPE yy0;\n",pcVar15);
      iVar6 = iVar6 + 3;
      if (0 < iVar8) {
        uVar14 = 1;
        if (1 < (int)local_60) {
          uVar14 = (ulong)__nmemb & 0xffffffff;
        }
        uVar20 = 0;
        do {
          __ptr = *(void **)((long)__ptr_00 + uVar20 * 8);
          if (__ptr != (void *)0x0) {
            fprintf((FILE *)out,"  %s yy%d;\n",__ptr,(ulong)((int)uVar20 + 1));
            iVar6 = iVar6 + 1;
            free(__ptr);
          }
          uVar20 = uVar20 + 1;
        } while (uVar14 != uVar20);
      }
      if (lemp->errsym->useCnt != 0) {
        fprintf((FILE *)out,"  int yy%d;\n",(ulong)(uint)lemp->errsym->dtnum);
        iVar6 = iVar6 + 1;
      }
      free(__s1);
      free(__ptr_00);
      fwrite("} YYMINORTYPE;\n",0xf,1,(FILE *)out);
      *plineno = iVar6 + 1;
      return;
    }
  }
  print_stack_union_cold_2();
  iVar8 = *(int *)((long)__s2 + 0xc) - *(int *)((long)ppsVar17 + 0xc);
  if (iVar8 == 0) {
    iVar8 = *(int *)(ppsVar17 + 2) - *(int *)(__s2 + 2);
  }
  if ((ppsVar17 != __s2) && (iVar8 == 0)) {
    __assert_fail("c!=0 || p1==p2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                  ,0xf81,"int axset_compare(const void *, const void *)");
  }
  return;
}

Assistant:

void print_stack_union(
  FILE *out,                  /* The output stream */
  struct lemon *lemp,         /* The main info structure for this parser */
  int *plineno,               /* Pointer to the line number */
  int mhflag                  /* True if generating makeheaders output */
){
  int lineno = *plineno;    /* The line number of the output */
  char **types;             /* A hash table of datatypes */
  int arraysize;            /* Size of the "types" array */
  int maxdtlength;          /* Maximum length of any ".datatype" field. */
  char *stddt;              /* Standardized name for a datatype */
  int i,j;                  /* Loop counters */
  unsigned hash;            /* For hashing the name of a type */
  const char *name;         /* Name of the parser */

  /* Allocate and initialize types[] and allocate stddt[] */
  arraysize = lemp->nsymbol * 2;
  types = (char**)calloc( arraysize, sizeof(char*) );
  if( types==0 ){
    fprintf(stderr,"Out of memory.\n");
    exit(1);
  }
  maxdtlength = 0;
  if( lemp->vartype ){
    maxdtlength = lemonStrlen(lemp->vartype);
  }
  for(i=0; i<lemp->nsymbol; i++){
    int len;
    struct symbol *sp = lemp->symbols[i];
    if( sp->datatype==0 ) continue;
    len = lemonStrlen(sp->datatype);
    if( len>maxdtlength ) maxdtlength = len;
  }
  stddt = (char*)malloc( maxdtlength*2 + 1 );
  if( types==0 || stddt==0 ){
    fprintf(stderr,"Out of memory.\n");
    exit(1);
  }

  /* Build a hash table of datatypes. The ".dtnum" field of each symbol
  ** is filled in with the hash index plus 1.  A ".dtnum" value of 0 is
  ** used for terminal symbols.  If there is no %default_type defined then
  ** 0 is also used as the .dtnum value for nonterminals which do not specify
  ** a datatype using the %type directive.
  */
  for(i=0; i<lemp->nsymbol; i++){
    struct symbol *sp = lemp->symbols[i];
    char *cp;
    if( sp==lemp->errsym ){
      sp->dtnum = arraysize+1;
      continue;
    }
    if( sp->type!=NONTERMINAL || (sp->datatype==0 && lemp->vartype==0) ){
      sp->dtnum = 0;
      continue;
    }
    cp = sp->datatype;
    if( cp==0 ) cp = lemp->vartype;
    j = 0;
    while( ISSPACE(*cp) ) cp++;
    while( *cp ) stddt[j++] = *cp++;
    while( j>0 && ISSPACE(stddt[j-1]) ) j--;
    stddt[j] = 0;
    if( lemp->tokentype && strcmp(stddt, lemp->tokentype)==0 ){
      sp->dtnum = 0;
      continue;
    }
    hash = 0;
    for(j=0; stddt[j]; j++){
      hash = hash*53 + stddt[j];
    }
    hash = (hash & 0x7fffffff)%arraysize;
    while( types[hash] ){
      if( strcmp(types[hash],stddt)==0 ){
        sp->dtnum = hash + 1;
        break;
      }
      hash++;
      if( hash>=(unsigned)arraysize ) hash = 0;
    }
    if( types[hash]==0 ){
      sp->dtnum = hash + 1;
      types[hash] = (char*)malloc( lemonStrlen(stddt)+1 );
      if( types[hash]==0 ){
        fprintf(stderr,"Out of memory.\n");
        exit(1);
      }
      strcpy(types[hash],stddt);
    }
  }

  /* Print out the definition of YYTOKENTYPE and YYMINORTYPE */
  name = lemp->name ? lemp->name : "Parse";
  lineno = *plineno;
  if( mhflag ){ fprintf(out,"#if INTERFACE\n"); lineno++; }
  fprintf(out,"#define %sTOKENTYPE %s\n",name,
    lemp->tokentype?lemp->tokentype:"void*");  lineno++;
  if( mhflag ){ fprintf(out,"#endif\n"); lineno++; }
  fprintf(out,"typedef union {\n"); lineno++;
  fprintf(out,"  int yyinit;\n"); lineno++;
  fprintf(out,"  %sTOKENTYPE yy0;\n",name); lineno++;
  for(i=0; i<arraysize; i++){
    if( types[i]==0 ) continue;
    fprintf(out,"  %s yy%d;\n",types[i],i+1); lineno++;
    free(types[i]);
  }
  if( lemp->errsym->useCnt ){
    fprintf(out,"  int yy%d;\n",lemp->errsym->dtnum); lineno++;
  }
  free(stddt);
  free(types);
  fprintf(out,"} YYMINORTYPE;\n"); lineno++;
  *plineno = lineno;
}